

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall HighsCutGeneration::separateLiftedMixedIntegerCover(HighsCutGeneration *this)

{
  double *pdVar1;
  bool bVar2;
  size_type sVar3;
  reference piVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  difference_type dVar8;
  reference pvVar9;
  int __x;
  long in_RDI;
  double extraout_XMM0_Qa;
  double z;
  double dVar10;
  HighsCDouble HVar11;
  HighsInt i_4;
  anon_class_80_10_b343329f gamma_l;
  int64_t kmax;
  anon_class_24_3_2d909add phi_l;
  HighsInt kmin;
  HighsCDouble cplusthreshold;
  HighsCDouble ulminusetaplusone;
  HighsCDouble r;
  double eta;
  double mudival;
  HighsInt cplussize;
  HighsInt i_3;
  HighsCDouble mu;
  HighsCDouble mlu;
  double upperl;
  HighsCDouble al;
  double jlVal;
  HighsCDouble mcplus;
  HighsInt cplusend;
  HighsCDouble cplusthreshold_1;
  HighsCDouble ulminusetaplusone_1;
  double eta_1;
  double mudival_1;
  HighsCDouble mu_1;
  double mju;
  bool atUpper;
  double ub_1;
  HighsInt j;
  HighsInt i_2;
  bool bestlAtUpper;
  double bestlVal;
  HighsInt bestlCplusend;
  HighsInt lpos;
  double ub;
  HighsInt i_1;
  HighsInt c;
  HighsCDouble msum;
  HighsCDouble usum;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> m;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> u;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> a;
  anon_class_8_1_8991fb9c comp;
  HighsInt i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  HighsInt l;
  HighsInt coversize;
  HighsCDouble *in_stack_fffffffffffff998;
  HighsCDouble *in_stack_fffffffffffff9a0;
  HighsCDouble *in_stack_fffffffffffff9a8;
  anon_class_8_1_8991fb9c in_stack_fffffffffffff9b0;
  const_iterator in_stack_fffffffffffff9b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9c0;
  anon_class_8_1_8991fb9c_for__M_comp in_stack_fffffffffffff9c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9d8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_fffffffffffffa70;
  iterator in_stack_fffffffffffffa78;
  int local_454;
  HighsCDouble local_450;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  HighsCutGeneration *local_418;
  undefined4 *local_410;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *local_400;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *local_3f8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *local_3f0;
  double *local_3e8;
  double *local_3e0;
  HighsCDouble *local_3d8;
  double *local_3d0;
  long *local_3c8;
  long local_3c0;
  HighsCDouble *local_3b8;
  int *local_3b0;
  double *local_3a8;
  int local_39c;
  double local_398;
  double local_390;
  HighsCDouble local_388;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  HighsCDouble local_358;
  double local_348;
  double dStack_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  anon_class_80_10_b343329f *this_00;
  undefined4 local_2f8;
  int local_2f4;
  HighsCDouble *local_2f0;
  HighsCDouble *local_2e8;
  HighsCDouble *local_2e0;
  HighsCDouble *local_2d8;
  HighsCDouble *local_2c8;
  HighsCDouble *local_2c0;
  HighsCDouble *local_2b8;
  HighsCDouble *local_2b0;
  int *local_2a0;
  int *local_298;
  int *local_290;
  HighsCDouble *local_280;
  HighsCDouble *local_278;
  HighsCDouble *local_270;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  value_type local_240;
  HighsCDouble local_238;
  undefined4 local_224;
  HighsCDouble local_220;
  double local_210;
  double local_208;
  double local_200;
  int *local_1f8;
  double local_1e8;
  int *local_1e0;
  int *local_1d8;
  int *local_1d0;
  int local_1c4;
  HighsCDouble local_1c0;
  HighsCDouble local_1b0;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  HighsCDouble local_178;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  byte local_141;
  double local_140;
  int local_134;
  int local_130;
  byte local_129;
  double local_128;
  int local_120;
  int local_11c;
  double local_118;
  double local_110;
  value_type local_108;
  HighsCDouble local_100;
  value_type local_f0;
  int local_ec;
  HighsCDouble local_e8;
  HighsCDouble local_d8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_c8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_b0;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_98;
  long local_80;
  int *local_78;
  int *local_70;
  long local_68;
  int local_5c;
  int *local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  long local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  int local_18;
  int local_14;
  byte local_1;
  
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  *(undefined1 *)(in_RDI + 0xe1) = 0;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18));
  local_14 = (int)sVar3;
  local_18 = -1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x58c43d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current);
  local_48 = in_RDI + 0x18;
  local_50._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff998);
  local_58 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff998);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffff9a0,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffff998), bVar2) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_50);
    local_5c = *piVar4;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_30,(long)local_5c);
    *pvVar9 = '\x01';
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_50);
  }
  local_68 = in_RDI;
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff998);
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff998);
  local_80 = local_68;
  pdqsort_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0>
            (in_stack_fffffffffffff9c0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffff9b8._M_current,in_stack_fffffffffffff9b0);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x58c58c);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x58c599);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x58c5a6);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
             in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
             in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
             in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current);
  HighsCDouble::HighsCDouble(&local_d8,0.0);
  HighsCDouble::HighsCDouble(&local_e8,0.0);
  for (local_ec = 0; local_ec != local_14; local_ec = local_ec + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)local_ec);
    local_f0 = *pvVar5;
    pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (&local_b0,(long)local_ec);
    pvVar6->hi = local_d8.hi;
    pvVar6->lo = local_d8.lo;
    pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (&local_c8,(long)local_ec);
    pvVar6->hi = local_e8.hi;
    pvVar6->lo = local_e8.lo;
    HighsCDouble::HighsCDouble
              (&local_100,*(double *)(*(long *)(in_RDI + 0xc0) + (long)local_f0 * 8));
    pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (&local_98,(long)local_ec);
    pvVar6->hi = local_100.hi;
    pvVar6->lo = local_100.lo;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_f0);
    local_108 = *pvVar7;
    HighsCDouble::operator+=
              ((HighsCDouble *)in_stack_fffffffffffff9b0.this,(double)in_stack_fffffffffffff9a8);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](&local_98,(long)local_ec);
    HVar11 = ::operator*((double)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_118 = HVar11.hi;
    local_110 = HVar11.lo;
    HighsCDouble::operator+=(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  }
  pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                     (&local_b0,(long)local_14);
  pvVar6->hi = local_d8.hi;
  pvVar6->lo = local_d8.lo;
  pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                     (&local_c8,(long)local_14);
  pvVar6->hi = local_e8.hi;
  pvVar6->lo = local_e8.lo;
  local_11c = -1;
  local_120 = -1;
  local_128 = 0.0;
  local_129 = 1;
  for (local_130 = 0; local_130 != local_14; local_130 = local_130 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)local_130);
    local_134 = *pvVar5;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_134);
    local_140 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)local_134);
    local_141 = local_140 - *(double *)(in_RDI + 0xb0) <= *pvVar7;
    if ((!(bool)local_141) || ((local_129 & 1) != 0)) {
      local_150 = local_140 * *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_134 * 8);
      HVar11 = ::operator-((double)in_stack_fffffffffffff9b0.this,in_stack_fffffffffffff9a8);
      local_160 = HVar11.hi;
      local_158 = HVar11.lo;
      __x = (int)&local_160;
      bVar2 = HighsCDouble::operator<=(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
      if ((!bVar2) && (std::abs(__x), *(double *)(in_RDI + 0xb0) * 1000.0 <= extraout_XMM0_Qa)) {
        HVar11 = HighsCDouble::operator/(in_stack_fffffffffffff998,2.87497935666007e-317);
        local_178.hi = HVar11.hi;
        local_178.lo = HVar11.lo;
        local_168 = HighsCDouble::operator_cast_to_double(&local_178);
        bVar2 = HighsIntegers::isIntegral
                          ((double)in_stack_fffffffffffff9b0.this,(double)in_stack_fffffffffffff9a8)
        ;
        if (!bVar2) {
          local_180 = ceil(local_168);
          HighsCDouble::HighsCDouble(&local_1b0,local_140);
          HVar11 = HighsCDouble::operator-
                             (in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
          local_1a0 = HVar11.hi;
          local_198 = HVar11.lo;
          HVar11 = HighsCDouble::operator+
                             (in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
          local_190 = HVar11.hi;
          local_188 = HVar11.lo;
          HVar11 = HighsCDouble::operator*
                             ((HighsCDouble *)in_stack_fffffffffffff9b0.this,
                              (double)in_stack_fffffffffffff9a8);
          local_1c0.hi = HVar11.hi;
          local_1c0.lo = HVar11.lo;
          local_1d8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff998);
          local_1e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff998);
          local_1e8 = HighsCDouble::operator_cast_to_double(&local_1c0);
          local_1d0 = (int *)std::
                             upper_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,double,HighsCutGeneration::separateLiftedMixedIntegerCover()::__1>
                                       (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                                        in_stack_fffffffffffff9c0._M_current,
                                        in_stack_fffffffffffff9c8);
          local_1f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff998);
          dVar8 = __gnu_cxx::operator-
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff9a0,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff998);
          local_1c4 = (int)dVar8;
          pvVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                             (&local_c8,(long)local_1c4);
          local_208 = pvVar6->hi;
          local_200 = pvVar6->lo;
          if (local_130 < local_1c4) {
            HighsCDouble::operator-=(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
          }
          HVar11 = HighsCDouble::operator+
                             (in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
          local_220.hi = HVar11.hi;
          local_220.lo = HVar11.lo;
          local_210 = HighsCDouble::operator_cast_to_double(&local_220);
          if ((local_128 < local_210) || (((local_141 & 1) == 0 && ((local_129 & 1) != 0)))) {
            local_11c = local_130;
            local_120 = local_1c4;
            local_129 = local_141 & 1;
            local_128 = local_210;
          }
        }
      }
    }
  }
  if (local_11c == -1) {
    local_1 = 0;
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)local_11c);
    local_18 = *pvVar5;
    HighsCDouble::HighsCDouble
              (&local_238,*(double *)(*(long *)(in_RDI + 0xc0) + (long)local_18 * 8));
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_18);
    local_240 = *pvVar7;
    HVar11 = ::operator*((double)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_250 = HVar11.hi;
    local_248 = HVar11.lo;
    HVar11 = HighsCDouble::operator-(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_260 = HVar11.hi;
    local_258 = HVar11.lo;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
               in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current)
    ;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0._M_current,
               (size_type)in_stack_fffffffffffff9b8._M_current);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
               in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current)
    ;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
               in_stack_fffffffffffff9c0._M_current,(size_type)in_stack_fffffffffffff9b8._M_current)
    ;
    if (local_11c < local_120) {
      local_278 = (HighsCDouble *)
                  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::begin
                            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                             in_stack_fffffffffffff998);
      local_270 = (HighsCDouble *)
                  __gnu_cxx::
                  __normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  ::operator+((__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                               *)in_stack_fffffffffffff9a8,
                              (difference_type)in_stack_fffffffffffff9a0);
      __gnu_cxx::
      __normal_iterator<HighsCDouble_const*,std::vector<HighsCDouble,std::allocator<HighsCDouble>>>
      ::__normal_iterator<HighsCDouble*>
                ((__normal_iterator<const_HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff9a0,
                 (__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff998);
      local_280 = (HighsCDouble *)
                  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::erase
                            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                             in_stack_fffffffffffff9b0.this,in_stack_fffffffffffff9b8);
      local_298 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff998);
      local_290 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_fffffffffffff9a8,
                                   (difference_type)in_stack_fffffffffffff9a0);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffff9a0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffff998);
      local_2a0 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                   ((vector<int,_std::allocator<int>_> *)
                                    in_stack_fffffffffffff9b0.this,
                                    (const_iterator)in_stack_fffffffffffff9b8._M_current);
      local_2c0 = (HighsCDouble *)
                  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::begin
                            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                             in_stack_fffffffffffff998);
      local_2b8 = (HighsCDouble *)
                  __gnu_cxx::
                  __normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  ::operator+((__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                               *)in_stack_fffffffffffff9a8,
                              (difference_type)in_stack_fffffffffffff9a0);
      local_2b0 = (HighsCDouble *)
                  __gnu_cxx::
                  __normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  ::operator+((__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                               *)in_stack_fffffffffffff9a8,
                              (difference_type)in_stack_fffffffffffff9a0);
      __gnu_cxx::
      __normal_iterator<HighsCDouble_const*,std::vector<HighsCDouble,std::allocator<HighsCDouble>>>
      ::__normal_iterator<HighsCDouble*>
                ((__normal_iterator<const_HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff9a0,
                 (__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff998);
      local_2c8 = (HighsCDouble *)
                  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::erase
                            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                             in_stack_fffffffffffff9b0.this,in_stack_fffffffffffff9b8);
      in_stack_fffffffffffffa70 = &local_c8;
      local_2e8 = (HighsCDouble *)
                  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::begin
                            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                             in_stack_fffffffffffff998);
      local_2e0 = (HighsCDouble *)
                  __gnu_cxx::
                  __normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  ::operator+((__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                               *)in_stack_fffffffffffff9a8,
                              (difference_type)in_stack_fffffffffffff9a0);
      local_2d8 = (HighsCDouble *)
                  __gnu_cxx::
                  __normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  ::operator+((__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                               *)in_stack_fffffffffffff9a8,
                              (difference_type)in_stack_fffffffffffff9a0);
      __gnu_cxx::
      __normal_iterator<HighsCDouble_const*,std::vector<HighsCDouble,std::allocator<HighsCDouble>>>
      ::__normal_iterator<HighsCDouble*>
                ((__normal_iterator<const_HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff9a0,
                 (__normal_iterator<HighsCDouble_*,_std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>_>
                  *)in_stack_fffffffffffff998);
      in_stack_fffffffffffffa78 =
           std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::erase
                     ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                      in_stack_fffffffffffff9b0.this,in_stack_fffffffffffff9b8);
      local_2f0 = in_stack_fffffffffffffa78._M_current;
      local_2f4 = local_11c;
      while (local_2f4 = local_2f4 + 1, local_2f4 < local_120) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_b0,(long)local_2f4);
        HighsCDouble::operator-=(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_c8,(long)local_2f4);
        HighsCDouble::operator-=(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      }
    }
    sVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::size(&local_98);
    local_2f8 = (undefined4)sVar3;
    HVar11 = HighsCDouble::operator/(in_stack_fffffffffffff998,(HighsCDouble *)0x58d34d);
    z = HVar11.hi;
    this_00 = (anon_class_80_10_b343329f *)HVar11.lo;
    dVar10 = HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xfffffffffffffcf0);
    local_318 = ceil(dVar10);
    floor(dVar10);
    local_348 = local_238.hi;
    dStack_340 = local_238.lo;
    HVar11 = ::operator*((double)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_338 = HVar11.hi;
    local_330 = HVar11.lo;
    HVar11 = HighsCDouble::operator-(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_328 = HVar11.hi;
    local_320 = HVar11.lo;
    bVar2 = HighsCDouble::operator<(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    if (bVar2) {
      HighsCDouble::HighsCDouble(&local_358,0.0);
      local_328 = local_358.hi;
      local_320 = local_358.lo;
    }
    HighsCDouble::HighsCDouble(&local_388,local_240);
    HVar11 = HighsCDouble::operator-(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    local_378 = HVar11.hi;
    local_370 = HVar11.lo;
    HVar11 = HighsCDouble::operator+(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    local_368 = HVar11.hi;
    local_360 = HVar11.lo;
    HVar11 = HighsCDouble::operator*(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_398 = HVar11.hi;
    local_390 = HVar11.lo;
    dVar10 = floor((local_318 - local_240) - 0.5);
    local_39c = (int)dVar10;
    local_3b0 = &local_39c;
    local_3b8 = &local_238;
    local_3a8 = &local_328;
    dVar10 = floor((local_240 - local_318) + 0.5);
    local_3c0 = (long)dVar10;
    local_410 = &local_2f8;
    local_400 = &local_c8;
    local_3f8 = &local_98;
    local_3f0 = &local_b0;
    local_3e8 = &local_398;
    local_3e0 = &local_368;
    local_3c8 = &local_3c0;
    local_3d8 = &local_238;
    local_3d0 = &local_328;
    HighsCDouble::HighsCDouble(&local_450,local_240);
    HVar11 = HighsCDouble::operator-(in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    local_440 = HVar11.hi;
    local_438 = HVar11.lo;
    HVar11 = HighsCDouble::operator*(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_430 = HVar11.hi;
    local_428 = HVar11.lo;
    HVar11 = HighsCDouble::operator-(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_420 = HVar11.hi;
    in_stack_fffffffffffff9b0.this = (HighsCutGeneration *)HVar11.lo;
    *(double *)(in_RDI + 0xd0) = local_420;
    *(HighsCutGeneration **)(in_RDI + 0xd8) = in_stack_fffffffffffff9b0.this;
    *(undefined1 *)(in_RDI + 0xe0) = 1;
    *(undefined1 *)(in_RDI + 0xe1) = 0;
    local_418 = in_stack_fffffffffffff9b0.this;
    for (local_454 = 0; local_454 != *(int *)(in_RDI + 0xe4); local_454 = local_454 + 1) {
      dVar10 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_454 * 8);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98)
                            ,(long)local_454);
        if (*pvVar9 == '\0') {
          pdVar1 = (double *)(*(long *)(in_RDI + 0xc0) + (long)local_454 * 8);
          if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
            *(undefined8 *)(*(long *)(in_RDI + 0xc0) + (long)local_454 * 8) = 0;
          }
          else {
            *(undefined1 *)(in_RDI + 0xe0) = 0;
          }
        }
        else {
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_30,(long)local_454);
          if (*pvVar9 == '\0') {
            dVar10 = separateLiftedMixedIntegerCover::anon_class_80_10_b343329f::operator()
                               (this_00,z);
            *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_454 * 8) = dVar10;
          }
          else {
            dVar10 = separateLiftedMixedIntegerCover::anon_class_24_3_2d909add::operator()
                               ((anon_class_24_3_2d909add *)in_stack_fffffffffffffa78._M_current,
                                (double)in_stack_fffffffffffffa70);
            *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_454 * 8) = -dVar10;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_454);
            HighsCDouble::operator+=((HighsCDouble *)in_stack_fffffffffffff9b0.this,dVar10);
          }
        }
      }
    }
    local_1 = 1;
  }
  local_224 = 1;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_fffffffffffff9b0.this);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_fffffffffffff9b0.this);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_fffffffffffff9b0.this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9b0.this
            );
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedIntegerCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();

  HighsInt l = -1;

  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);
  for (HighsInt i : cover) coverflag[i] = 1;

  auto comp = [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; };
  pdqsort_branchless(cover.begin(), cover.end(), comp);

  std::vector<HighsCDouble> a;
  std::vector<HighsCDouble> u;
  std::vector<HighsCDouble> m;

  a.resize(coversize);
  u.resize(coversize + 1);
  m.resize(coversize + 1);

  HighsCDouble usum = 0.0;
  HighsCDouble msum = 0.0;
  // set up the partial sums of the upper bounds, and the contributions
  for (HighsInt c = 0; c != coversize; ++c) {
    HighsInt i = cover[c];

    u[c] = usum;
    m[c] = msum;
    a[c] = vals[i];
    double ub = upper[i];
    usum += ub;
    msum += ub * a[c];
  }

  u[coversize] = usum;
  m[coversize] = msum;

  // determine which variable in the cover we want to create the MIR inequality
  // from which we lift we try to select a variable to have the highest chance
  // of satisfying the facet conditions for the superadditive lifting function
  // gamma to be satisfied.
  HighsInt lpos = -1;
  HighsInt bestlCplusend = -1;
  double bestlVal = 0.0;
  bool bestlAtUpper = true;

  for (HighsInt i = 0; i != coversize; ++i) {
    HighsInt j = cover[i];
    double ub = upper[j];

    bool atUpper = solval[j] >= ub - feastol;
    if (atUpper && !bestlAtUpper) continue;

    double mju = ub * vals[j];
    HighsCDouble mu = mju - lambda;

    if (mu <= 10 * feastol) continue;
    if (std::abs(vals[j]) < 1000 * feastol) continue;

    double mudival = double(mu / vals[j]);
    if (HighsIntegers::isIntegral(mudival, feastol)) continue;
    double eta = ceil(mudival);

    HighsCDouble ulminusetaplusone = HighsCDouble(ub) - eta + 1.0;
    HighsCDouble cplusthreshold = ulminusetaplusone * vals[j];

    HighsInt cplusend =
        std::upper_bound(cover.begin(), cover.end(), double(cplusthreshold),
                         [&](double cplusthreshold, HighsInt i) {
                           return cplusthreshold > vals[i];
                         }) -
        cover.begin();

    HighsCDouble mcplus = m[cplusend];
    if (i < cplusend) mcplus -= mju;

    double jlVal = double(mcplus + eta * vals[j]);

    if (jlVal > bestlVal || (!atUpper && bestlAtUpper)) {
      lpos = i;
      bestlCplusend = cplusend;
      bestlVal = jlVal;
      bestlAtUpper = atUpper;
    }
  }

  if (lpos == -1) return false;

  l = cover[lpos];
  HighsCDouble al = vals[l];
  double upperl = upper[l];
  HighsCDouble mlu = upperl * al;
  HighsCDouble mu = mlu - lambda;

  a.resize(bestlCplusend);
  cover.resize(bestlCplusend);
  u.resize(bestlCplusend + 1);
  m.resize(bestlCplusend + 1);

  if (lpos < bestlCplusend) {
    a.erase(a.begin() + lpos);
    cover.erase(cover.begin() + lpos);
    u.erase(u.begin() + lpos + 1);
    m.erase(m.begin() + lpos + 1);
    for (HighsInt i = lpos + 1; i < bestlCplusend; ++i) {
      u[i] -= upperl;
      m[i] -= mlu;
    }
  }

  HighsInt cplussize = a.size();

  assert(mu > 10 * feastol);

  double mudival = double(mu / al);
  double eta = ceil(mudival);
  HighsCDouble r = mu - floor(mudival) * HighsCDouble(al);
  // we multiply with r and it is important that it does not flip the sign
  // so we safe guard against tiny numerical errors here
  if (r < 0) r = 0;

  HighsCDouble ulminusetaplusone = HighsCDouble(upperl) - eta + 1.0;
  HighsCDouble cplusthreshold = ulminusetaplusone * al;

  HighsInt kmin = floor(eta - upperl - 0.5);

  auto phi_l = [&](double a) {
    assert(a < 0);

    int64_t k = std::min(int64_t(a / double(al)), int64_t(-1));

    for (; k >= kmin; --k) {
      if (a >= k * al + r) {
        assert(a < (k + 1) * al);
        return double(a - (k + 1) * r);
      }

      if (a >= k * al) {
        assert(a < k * al + r);
        return double(k * (al - r));
      }
    }

    assert(a <= -lambda + epsilon);
    return double(kmin * (al - r));
  };

  int64_t kmax = floor(upperl - eta + 0.5);

  auto gamma_l = [&](double z) {
    assert(z > 0);
    for (HighsInt i = 0; i < cplussize; ++i) {
      HighsInt upperi = upper[cover[i]];

      for (HighsInt h = 0; h <= upperi; ++h) {
        HighsCDouble mih = m[i] + h * a[i];
        HighsCDouble uih = u[i] + h;
        HighsCDouble mihplusdeltai = mih + a[i] - cplusthreshold;
        if (z <= mihplusdeltai) {
          assert(mih <= z + epsilon);
          return double(uih * ulminusetaplusone * (al - r));
        }

        int64_t k = ((int64_t)(double)((z - mihplusdeltai) / al)) - 1;
        for (; k <= kmax; ++k) {
          if (z <= mihplusdeltai + k * al + r) {
            assert(mihplusdeltai + k * al <= z);
            return double((uih * ulminusetaplusone + k) * (al - r));
          }

          if (z <= mihplusdeltai + (k + 1) * al) {
            assert(mihplusdeltai + k * al + r <= z);
            return double((uih * ulminusetaplusone) * (al - r) + z - mih -
                          a[i] + cplusthreshold - (k + 1) * r);
          }
        }
      }
    }

    int64_t p = ((int64_t)(double)((z - m[cplussize]) / al)) - 1;
    for (;; ++p) {
      if (z <= m[cplussize] + p * al + r) {
        assert(m[cplussize] + p * al <= z);
        return double((u[cplussize] * ulminusetaplusone + p) * (al - r));
      }

      if (z <= m[cplussize] + (p + 1) * al) {
        assert(m[cplussize] + p * al + r <= z);
        return double((u[cplussize] * ulminusetaplusone) * (al - r) + z -
                      m[cplussize] - (p + 1) * r);
      }
    }
  };

  rhs = (HighsCDouble(upperl) - eta) * r - lambda;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (vals[i] == 0.0) continue;
    if (!isintegral[i]) {
      if (vals[i] < 0.0)
        integralSupport = false;
      else
        vals[i] = 0.0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = -phi_l(-vals[i]);
      rhs += vals[i] * upper[i];
    } else {
      vals[i] = gamma_l(vals[i]);
    }
  }

  return true;
}